

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O2

void CB::print_update(vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores)

{
  float fVar1;
  bool holdout_set_off;
  uint32_t prediction;
  shared_data *psVar2;
  pointer ppeVar3;
  example *peVar4;
  wclass *pwVar5;
  size_t current_pass;
  ostream *poVar6;
  ostringstream *poVar7;
  long lVar8;
  char *pcVar9;
  size_t num_features;
  string label_buf;
  string local_1c0;
  ostringstream pred_buf;
  undefined8 uStack_190;
  uint auStack_188 [88];
  
  psVar2 = all->sd;
  if ((((double)psVar2->dump_interval <=
        psVar2->weighted_labeled_examples + psVar2->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    if (ec_seq == (multi_ex *)0x0) {
      num_features = ec->num_features;
    }
    else {
      ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      num_features = 0;
      for (lVar8 = 0;
          (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3 != lVar8; lVar8 = lVar8 + 1)
      {
        peVar4 = ppeVar3[lVar8];
        pwVar5 = (peVar4->l).cs.costs._begin;
        if ((((long)(peVar4->l).cs.costs._end - (long)pwVar5 != 0x10) ||
            (fVar1 = pwVar5->partial_prediction, fVar1 != -1.0)) || (NAN(fVar1))) {
          num_features = num_features + peVar4->num_features;
        }
      }
    }
    prediction = (ec->pred).multiclass;
    label_buf._M_dataplus._M_p = (pointer)&label_buf.field_2;
    label_buf._M_string_length = 0;
    label_buf.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&label_buf);
    if (action_scores) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pred_buf);
      poVar7 = &pred_buf;
      *(undefined8 *)((long)&uStack_190 + *(long *)(_pred_buf + -0x18)) = 8;
      *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) & 0xffffff4f | 0x80;
      std::operator<<(poVar7,0x20);
      if ((ec->pred).scalars._end == (ec->pred).scalars._begin) {
        pcVar9 = "no action";
      }
      else {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&pred_buf);
        poVar6 = std::operator<<(poVar6,":");
        poVar7 = (ostringstream *)std::ostream::operator<<(poVar6,((ec->pred).a_s._begin)->score);
        pcVar9 = "...";
      }
      std::operator<<((ostream *)poVar7,pcVar9);
      psVar2 = all->sd;
      current_pass = all->current_pass;
      holdout_set_off = all->holdout_set_off;
      std::__cxx11::stringbuf::str();
      shared_data::print_update
                (psVar2,holdout_set_off,current_pass,&label_buf,&local_1c0,num_features,
                 all->progress_add,all->progress_arg);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pred_buf);
    }
    else {
      shared_data::print_update
                (all->sd,all->holdout_set_off,all->current_pass,&label_buf,prediction,num_features,
                 all->progress_add,all->progress_arg);
    }
    std::__cxx11::string::~string((string *)&label_buf);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_features = ec.num_features;

    size_t pred = ec.pred.multiclass;
    if (ec_seq != nullptr)
    {
      num_features = 0;
      // TODO: code duplication csoaa.cc LabelDict::ec_is_example_header
      for (size_t i = 0; i < (*ec_seq).size(); i++)
        if (!CB::ec_is_example_header(*(*ec_seq)[i]))
          num_features += (*ec_seq)[i]->num_features;
    }
    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores)
    {
      std::ostringstream pred_buf;
      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (ec.pred.a_s.size() > 0)
        pred_buf << ec.pred.a_s[0].action << ":" << ec.pred.a_s[0].score << "...";
      else
        pred_buf << "no action";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_features,
          all.progress_add, all.progress_arg);
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, (uint32_t)pred, num_features,
          all.progress_add, all.progress_arg);
  }
}